

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_merge_to_ctx(lyd_node **trg,lyd_node *src,int options,ly_ctx *ctx)

{
  LYS_NODE LVar1;
  int iVar2;
  uint dflt;
  lys_node *plVar3;
  char *pcVar4;
  lyd_node *plVar5;
  lyd_node *plVar6;
  lys_node *schema;
  lyd_node *plVar7;
  lys_module *plVar8;
  lyd_node *plVar9;
  char *format;
  int iVar10;
  lyd_node *source;
  ly_ctx *plVar11;
  lyd_node *plVar12;
  int iVar13;
  lyd_node *node;
  int iVar14;
  lyd_node **pplVar15;
  bool bVar16;
  lyd_node *local_80;
  lys_node *local_78;
  uint local_6c;
  lyd_node *local_60;
  
  if ((trg == (lyd_node **)0x0) || (node = *trg, src == (lyd_node *)0x0 || node == (lyd_node *)0x0))
  {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_merge_to_ctx");
    return -1;
  }
  plVar3 = node->schema;
  do {
    plVar3 = lys_parent(plVar3);
    if (plVar3 == (lys_node *)0x0) goto LAB_00162306;
  } while (plVar3->nodetype == LYS_USES);
  pcVar4 = lyp_get_yang_data_template_name(node);
  if (pcVar4 == (char *)0x0) {
    ly_log(plVar3->module->ctx,LY_LLERR,LY_EINVAL,"Target not a top-level data tree.");
    return -1;
  }
LAB_00162306:
  plVar11 = node->schema->module->ctx;
  if ((ctx == (ly_ctx *)0x0) || (plVar6 = node, plVar11 == ctx)) {
    plVar3 = src->schema;
    if ((plVar3->module->ctx == plVar11) && (bVar16 = plVar11 == ctx, plVar11 = ctx, bVar16)) {
      plVar11 = (ly_ctx *)0x0;
    }
  }
  else {
    do {
      node = plVar6;
      plVar6 = node->prev;
    } while (node->prev->next != (lyd_node *)0x0);
    *trg = node;
    plVar6 = (lyd_node *)0x0;
    for (; node != (lyd_node *)0x0; node = node->next) {
      plVar5 = lyd_dup_to_ctx(node,1,ctx);
      if ((plVar5 == (lyd_node *)0x0) ||
         ((plVar6 != (lyd_node *)0x0 &&
          (iVar2 = lyd_insert_after(plVar6->prev,plVar5), plVar5 = plVar6, iVar2 != 0))))
      goto LAB_001627e2;
      plVar6 = plVar5;
    }
    plVar3 = src->schema;
    plVar11 = ctx;
    node = plVar6;
  }
  iVar2 = 0;
  while ((plVar3 = lys_parent(plVar3), plVar3 != (lys_node *)0x0 && (plVar3->nodetype != LYS_EXT)))
  {
    iVar2 = iVar2 + -1;
  }
  local_6c = 1;
  dflt = local_6c;
  if (iVar2 != 0) {
    plVar6 = src;
    if (((uint)options >> 0xc & 1) == 0) {
      for (; plVar6 != (lyd_node *)0x0; plVar6 = plVar6->next) {
        if ((plVar6->field_0x9 & 1) == 0) {
          dflt = 0;
          break;
        }
      }
    }
    else {
      dflt = (byte)src->field_0x9 & 1;
    }
  }
  local_80 = (lyd_node *)0x0;
  local_78 = (lys_node *)0x0;
  iVar13 = 0;
  plVar6 = node;
  plVar5 = (lyd_node *)0x0;
  do {
    plVar7 = plVar5;
    iVar14 = -iVar13 - iVar2;
    plVar3 = src->schema;
    do {
      schema = plVar3;
      iVar10 = 0;
      if (0 < iVar14) {
        iVar10 = iVar14;
      }
      while (bVar16 = iVar10 != 0, iVar10 = iVar10 + -1, bVar16) {
        schema = lys_parent(schema);
      }
      plVar3 = src->schema;
      if (schema == plVar3) {
        plVar5 = src;
        if (((uint)options >> 10 & 1) != 0) goto LAB_00162604;
        plVar12 = (lyd_node *)0x0;
        goto LAB_001625b0;
      }
      iVar13 = iVar13 + 1;
      LVar1 = schema->nodetype;
      iVar14 = iVar14 + -1;
    } while ((LVar1 & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN);
    if (LVar1 != LYS_CONTAINER) {
      pcVar4 = strnodetype(LVar1);
      format = "Cannot create %s \"%s\" for the merge.";
LAB_0016291c:
      ly_log(plVar11,LY_LLERR,LY_EINVAL,format,pcVar4);
      break;
    }
    if (plVar7 == (lyd_node *)0x0) {
      local_80 = plVar6;
      if (local_6c == 0) {
        pplVar15 = &plVar6->child;
        goto LAB_001624f7;
      }
      while (plVar5 = plVar6, local_80 != (lyd_node *)0x0) {
        local_78 = schema;
        if ((plVar11 != (ly_ctx *)0x0) &&
           (local_78 = lys_get_schema_inctx(schema,plVar11), local_78 == (lys_node *)0x0)) {
          plVar8 = lys_node_module(schema);
          ly_log(plVar11,LY_LLERR,LY_EINVAL,
                 "Target context does not contain schema node for the data node being merged (%s:%s)."
                 ,plVar8->name,schema->name);
          goto LAB_001627e2;
        }
        plVar5 = local_80;
        if (local_80->schema == local_78) break;
        pplVar15 = &local_80->next;
LAB_001624f7:
        local_80 = *pplVar15;
      }
      if (((uint)options >> 10 & 1) == 0) {
        schema = local_78;
      }
      local_6c = 0;
      plVar6 = plVar5;
    }
    else if ((((uint)options >> 10 & 1) == 0 && plVar11 != (ly_ctx *)0x0) &&
            (schema = lys_get_schema_inctx(schema,plVar11), schema == (lys_node *)0x0)) {
      plVar8 = lys_node_module((lys_node *)0x0);
      pcVar4 = plVar8->name;
      format = "Target context does not contain schema node for the data node being merged (%s:%s)."
      ;
      goto LAB_0016291c;
    }
    plVar5 = plVar7;
  } while (((local_80 != (lyd_node *)0x0) ||
           (plVar5 = _lyd_new((lyd_node *)0x0,schema,dflt), plVar7 == (lyd_node *)0x0)) ||
          (iVar14 = lyd_insert(plVar5,plVar7), iVar14 == 0));
LAB_00162872:
  if (*trg != node) {
    lyd_free_withsiblings(node);
  }
  lyd_free_withsiblings(plVar7);
  return -1;
LAB_001625b0:
  if (src == (lyd_node *)0x0) goto LAB_00162658;
  plVar5 = lyd_dup_to_ctx(src,1,plVar11);
  if ((plVar5 == (lyd_node *)0x0) ||
     ((plVar12 != (lyd_node *)0x0 &&
      (iVar2 = lyd_insert_after(plVar12->prev,plVar5), plVar5 = plVar12, iVar2 != 0)))) {
    lyd_free_withsiblings(plVar12);
    goto LAB_00162872;
  }
  plVar12 = plVar5;
  if (((uint)options >> 0xc & 1) != 0) goto LAB_00162658;
  src = src->next;
  goto LAB_001625b0;
LAB_001627e2:
  plVar7 = (lyd_node *)0x0;
  goto LAB_00162872;
LAB_00162604:
  while ((plVar5 != (lyd_node *)0x0 &&
         (check_leaf_list_backlinks(plVar5,2), ((uint)options >> 0xc & 1) == 0))) {
    plVar5 = plVar5->next;
  }
  plVar5 = src->prev;
  plVar12 = src;
  if (plVar5 != src && ((uint)options >> 0xc & 1) != 0) {
    lyd_unlink(src);
    lyd_free_withsiblings(plVar5);
  }
LAB_00162658:
  plVar5 = plVar7;
  source = plVar12;
  if (plVar7 != (lyd_node *)0x0) {
    do {
      plVar9 = plVar5;
      plVar5 = plVar9->child;
    } while (plVar9->child != (lyd_node *)0x0);
    plVar9->child = plVar12;
    for (; source = plVar7, plVar12 != (lyd_node *)0x0; plVar12 = plVar12->next) {
      plVar12->parent = plVar9;
    }
  }
  plVar5 = node;
  if (local_6c != 0) {
    plVar11 = plVar6->schema->module->ctx;
    do {
      plVar7 = plVar6;
      plVar6 = plVar7->prev;
    } while (plVar7->prev->next != (lyd_node *)0x0);
    bVar16 = false;
    plVar6 = source;
LAB_001626b6:
    do {
      local_60 = plVar6;
      if (local_60 == (lyd_node *)0x0) {
        lyd_free_withsiblings(source);
        if (bVar16) goto LAB_00162809;
        goto LAB_001628b7;
      }
      plVar6 = local_60->next;
      for (plVar12 = plVar7; plVar12 != (lyd_node *)0x0; plVar12 = plVar12->next) {
        iVar2 = lyd_merge_node_schema_equal(plVar12,local_60);
        if ((iVar2 == 1) && (iVar2 = lyd_merge_node_equal(plVar12,local_60), 0 < iVar2)) {
          if (iVar2 == 2) {
            bVar16 = true;
          }
          LVar1 = plVar12->schema->nodetype;
          if (LVar1 != LYS_CONTAINER) {
            if (LVar1 != LYS_LEAF) {
              if (LVar1 == LYS_LEAFLIST) goto LAB_001626b6;
              if (LVar1 == LYS_LIST) goto LAB_001627ac;
              if (LVar1 != LYS_ANYDATA) {
                if ((((LVar1 == LYS_NOTIF) || (LVar1 == LYS_RPC)) || (LVar1 == LYS_INPUT)) ||
                   (LVar1 == LYS_OUTPUT)) goto LAB_001627ac;
                if (LVar1 != LYS_ANYXML) {
                  ly_log(plVar11,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                         ,0xb79);
                  lyd_free_withsiblings(source);
                  goto LAB_001627e2;
                }
              }
            }
            lyd_merge_node_update(plVar12,local_60);
            goto LAB_001626b6;
          }
LAB_001627ac:
          iVar2 = lyd_merge_parent_children(plVar12,local_60->child,options);
          if ((iVar2 == 0) || (bVar16 = true, iVar2 == 2)) goto LAB_001626b6;
LAB_001627d3:
          lyd_free_withsiblings(source);
          goto LAB_001627e2;
        }
        if (iVar2 == -1) goto LAB_001627d3;
      }
      if (plVar11 == local_60->schema->module->ctx) {
        lyd_unlink(local_60);
        if (local_60 == source) {
          source = plVar6;
        }
      }
      else {
        local_60 = lyd_dup_to_ctx(local_60,1,plVar11);
      }
      lyd_insert_after(plVar7->prev,local_60);
    } while( true );
  }
  iVar2 = lyd_merge_parent_children(plVar6,source,options);
  if (iVar2 != 0) {
    if (iVar2 != 2) {
      plVar7 = (lyd_node *)0x0;
      goto LAB_00162872;
    }
LAB_00162809:
    if (plVar5 != (lyd_node *)0x0) {
      plVar5->validity = plVar5->validity & 0x7f;
      plVar6 = plVar5;
      if (((plVar5->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
         (plVar7 = plVar5->child, plVar7 != (lyd_node *)0x0)) goto LAB_00162846;
      if (plVar5 == node) goto LAB_001628b7;
      do {
        plVar7 = plVar6->next;
LAB_00162846:
        plVar5 = plVar7;
      } while ((plVar7 == (lyd_node *)0x0) &&
              (plVar6 = plVar6->parent, plVar6->parent != node->parent));
      goto LAB_00162809;
    }
  }
LAB_001628b7:
  if (node->schema->nodetype == LYS_RPC) {
    lyd_schema_sort(node,1);
  }
  if (*trg != node) {
    lyd_free_withsiblings(*trg);
    *trg = node;
    return 0;
  }
  return 0;
}

Assistant:

API int
lyd_merge_to_ctx(struct lyd_node **trg, const struct lyd_node *src, int options, struct ly_ctx *ctx)
{
    struct lyd_node *node = NULL, *node2, *target, *trg_merge_start, *src_merge_start = NULL;
    const struct lyd_node *iter;
    struct lys_node *src_snode, *sch = NULL;
    int i, src_depth, depth, first_iter, ret, dflt = 1;
    const struct lys_node *parent = NULL;

    if (!trg || !(*trg) || !src) {
        LOGARG;
        return -1;
    }
    target = *trg;

    parent = lys_parent(target->schema);

    /* go up all uses */
    while (parent && (parent->nodetype == LYS_USES)) {
        parent = lys_parent(parent);
    }

    if (parent && !lyp_get_yang_data_template_name(target)) {
        LOGERR(parent->module->ctx, LY_EINVAL, "Target not a top-level data tree.");
        return -1;
    }

    /* get know if we are converting data into a different context */
    if (ctx && target->schema->module->ctx != ctx) {
        /* target's data tree context differs from the target context, move the target
         * data tree into the target context */

        /* get the first target's top-level and store it as the result */
        for (; target->prev->next; target = target->prev);
        *trg = target;

        for (node = NULL, trg_merge_start = target; target; target = target->next) {
            node2 = lyd_dup_to_ctx(target, 1, ctx);
            if (!node2) {
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    goto error;
                }
            } else {
                node = node2;
            }
        }
        target = node;
        node = NULL;
    } else if (src->schema->module->ctx != target->schema->module->ctx) {
        /* the source data will be converted into the target's context during the merge */
        ctx = target->schema->module->ctx;
    } else if (ctx == src->schema->module->ctx) {
        /* no conversion is needed */
        ctx = NULL;
    }

    /* find source top-level schema node */
    for (src_snode = src->schema, src_depth = 0;
         (src_snode = lys_parent(src_snode)) && src_snode->nodetype != LYS_EXT;
         ++src_depth);

    /* find first shared missing schema parent of the subtrees */
    trg_merge_start = target;
    depth = 0;
    first_iter = 1;
    if (src_depth) {
        /* we are going to create missing parents in the following loop,
         * but we will need to know a dflt flag for them. In case the newly
         * created parent is going to have at least one non-default child,
         * it will be also non-default, otherwise it will be the default node */
        if (options & LYD_OPT_NOSIBLINGS) {
            dflt = src->dflt;
        } else {
            LY_TREE_FOR(src, iter) {
                if (!iter->dflt) {
                    /* non default sibling -> parent is going to be
                     * created also as non-default */
                    dflt = 0;
                    break;
                }
            }
        }
    }
    while (1) {
        /* going from down (source root) to up (top-level or the common node with target */
        do {
            for (src_snode = src->schema, i = 0; i < src_depth - depth; src_snode = lys_parent(src_snode), ++i);
            ++depth;
        } while (src_snode != src->schema && (src_snode->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES)));

        if (src_snode == src->schema) {
            break;
        }

        if (src_snode->nodetype != LYS_CONTAINER) {
            /* we would have to create a list (the only data node with children except container), impossible */
            LOGERR(ctx, LY_EINVAL, "Cannot create %s \"%s\" for the merge.", strnodetype(src_snode->nodetype), src_snode->name);
            goto error;
        }

        /* have we created any missing containers already? if we did,
         * it is totally useless to search for match, there won't ever be */
        if (!src_merge_start) {
            if (first_iter) {
                node = trg_merge_start;
                first_iter = 0;
            } else {
                node = trg_merge_start->child;
            }

            /* find it in target data nodes */
            LY_TREE_FOR(node, node) {
                if (ctx) {
                    /* we have the schema nodes in the different context */
                    sch = lys_get_schema_inctx(src_snode, ctx);
                    if (!sch) {
                        LOGERR(ctx, LY_EINVAL, "Target context does not contain schema node for the data node being "
                               "merged (%s:%s).", lys_node_module(src_snode)->name, src_snode->name);
                        goto error;
                    }
                } else {
                    /* the context is same and comparison of the schema nodes will works fine */
                    sch = src_snode;
                }

                if (node->schema == sch) {
                    trg_merge_start = node;
                    break;
                }
            }

            if (!(options & LYD_OPT_DESTRUCT)) {
                /* the source tree will be duplicated, so to save some work in case
                 * of different target context, create also the parents nodes in the
                 * correct context */
                src_snode = sch;
            }
        } else if (ctx && !(options & LYD_OPT_DESTRUCT)) {
            /* get the schema node in the correct (target) context, same as above,
             * this is done to save some work and have the source in the same context
             * when the provided source tree is below duplicated in the target context
             * and connected into the parents created here */
            src_snode = lys_get_schema_inctx(src_snode, ctx);
            if (!src_snode) {
                LOGERR(ctx, LY_EINVAL, "Target context does not contain schema node for the data node being "
                       "merged (%s:%s).", lys_node_module(src_snode)->name, src_snode->name);
                goto error;
            }
        }

        if (!node) {
            /* it is not there, create it */
            node2 = _lyd_new(NULL, src_snode, dflt);
            if (!src_merge_start) {
                src_merge_start = node2;
            } else {
                if (lyd_insert(node2, src_merge_start)) {
                    goto error;
                }
                src_merge_start = node2;
            }
        }
    }

    /* process source according to options */
    if (options & LYD_OPT_DESTRUCT) {
        LY_TREE_FOR(src, iter) {
            check_leaf_list_backlinks((struct lyd_node *)iter, 2);
            if (options & LYD_OPT_NOSIBLINGS) {
                break;
            }
        }

        node = (struct lyd_node *)src;
        if ((node->prev != node) && (options & LYD_OPT_NOSIBLINGS)) {
            node2 = node->prev;
            lyd_unlink(node);
            lyd_free_withsiblings(node2);
        }
    } else {
        node = NULL;
        for (; src; src = src->next) {
            /* because we already have to duplicate it, do it in the correct context */
            node2 = lyd_dup_to_ctx(src, 1, ctx);
            if (!node2) {
                lyd_free_withsiblings(node);
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    lyd_free_withsiblings(node);
                    goto error;
                }
            } else {
                node = node2;
            }

            if (options & LYD_OPT_NOSIBLINGS) {
                break;
            }
        }
    }

    if (src_merge_start) {
        /* insert data into the created parents */
        /* first, get the lowest created parent, we don't have to check the nodetype since we are
         * creating only a simple chain of containers */
        for (node2 = src_merge_start; node2->child; node2 = node2->child);
        node2->child = node;
        LY_TREE_FOR(node, node) {
            node->parent = node2;
        }
    } else {
        src_merge_start = node;
    }

    if (!first_iter) {
        /* !! src_merge start is a child(ren) of trg_merge_start */
        ret = lyd_merge_parent_children(trg_merge_start, src_merge_start, options);
    } else {
        /* !! src_merge start is a (top-level) sibling(s) of trg_merge_start */
        ret = lyd_merge_siblings(trg_merge_start, src_merge_start, options);
    }
    /* it was freed whatever the return value */
    src_merge_start = NULL;
    if (ret == 2) {
        /* clear remporary LYD_VAL_INUSE validation flags */
        LY_TREE_DFS_BEGIN(target, node2, node) {
            node->validity &= ~LYD_VAL_INUSE;
            LY_TREE_DFS_END(target, node2, node);
        }
        ret = 0;
    } else if (ret) {
        goto error;
    }

    if (target->schema->nodetype == LYS_RPC) {
        lyd_schema_sort(target, 1);
    }

    /* update the pointer to the target tree if needed */
    if (*trg != target) {
        lyd_free_withsiblings(*trg);
        (*trg) = target;
    }
    return ret;

error:
    if (*trg != target) {
        /* target is duplication of the original target in different context,
         * free it due to the error */
        lyd_free_withsiblings(target);
    }
    lyd_free_withsiblings(src_merge_start);
    return -1;
}